

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_00195440;
  (this->assertionResult).m_info.macroName.m_start =
       (param_1->assertionResult).m_info.macroName.m_start;
  (this->assertionResult).m_info.macroName.m_size =
       (param_1->assertionResult).m_info.macroName.m_size;
  (this->assertionResult).m_info.macroName.m_data = (char *)0x0;
  uVar2 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.lineInfo.file + 4);
  sVar7 = (param_1->assertionResult).m_info.lineInfo.line;
  uVar3 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.lineInfo.line + 4);
  *(undefined4 *)&(this->assertionResult).m_info.lineInfo.file =
       *(undefined4 *)&(param_1->assertionResult).m_info.lineInfo.file;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.file + 4) = uVar2;
  *(int *)&(this->assertionResult).m_info.lineInfo.line = (int)sVar7;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.line + 4) = uVar3;
  (this->assertionResult).m_info.capturedExpression.m_start =
       (param_1->assertionResult).m_info.capturedExpression.m_start;
  (this->assertionResult).m_info.capturedExpression.m_size =
       (param_1->assertionResult).m_info.capturedExpression.m_size;
  (this->assertionResult).m_info.capturedExpression.m_data = (char *)0x0;
  (this->assertionResult).m_info.resultDisposition =
       (param_1->assertionResult).m_info.resultDisposition;
  (this->assertionResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.message.field_2;
  pcVar1 = (param_1->assertionResult).m_resultData.message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData,pcVar1,
             pcVar1 + (param_1->assertionResult).m_resultData.message._M_string_length);
  (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.reconstructedExpression.field_2;
  pcVar1 = (param_1->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData.reconstructedExpression,pcVar1,
             pcVar1 + (param_1->assertionResult).m_resultData.reconstructedExpression.
                      _M_string_length);
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (ITransientExpression *)0x0;
  (this->assertionResult).m_resultData.lazyExpression.m_isNegated =
       (param_1->assertionResult).m_resultData.lazyExpression.m_isNegated;
  (this->assertionResult).m_resultData.resultType =
       (param_1->assertionResult).m_resultData.resultType;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,&param_1->infoMessages);
  (this->totals).testCases.failedButOk = (param_1->totals).testCases.failedButOk;
  iVar8 = (param_1->totals).error;
  uVar2 = *(undefined4 *)&(param_1->totals).field_0x4;
  sVar7 = (param_1->totals).assertions.passed;
  sVar4 = (param_1->totals).assertions.failed;
  sVar5 = (param_1->totals).assertions.failedButOk;
  sVar6 = (param_1->totals).testCases.failed;
  (this->totals).testCases.passed = (param_1->totals).testCases.passed;
  (this->totals).testCases.failed = sVar6;
  (this->totals).assertions.failed = sVar4;
  (this->totals).assertions.failedButOk = sVar5;
  (this->totals).error = iVar8;
  *(undefined4 *)&(this->totals).field_0x4 = uVar2;
  (this->totals).assertions.passed = sVar7;
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;